

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void visibility_algorithm(void)

{
  return;
}

Assistant:

void visibility_algorithm()
{
	/* Let P be a simple nonclosed polygonal curve with n vertices v1, ..., vn.
	 * By padding the curve with additional vertices, if necessary, we can assume that n = 2^p + 1.
	 * Any subcurve of P of the form va, ..., vb, where a-1 is a multiple of 2^λ and b-a=2^λ is called a chain in grade λ.  Obviously,
	 *
	 * (i) a grade-λ chain has 2^λ+1 vertices,
	 * (ii) there are 2^(p-λ) chains in grade λ, and
	 * (iii) there are p+1 grades: 0,1, ..., p.
	 *
	 * We begin our work bottom-up, computing conformal submaps of granularity of roughly m^B,
	 * where m is the size of the underlying curve and B is some small enough positive constant;
	 * we set B=1/5, but to make the complexity analysis more explicit we leave B as a parameter in most of the calculations.
	 * We pursue the computation until the submap for the whole polygon has been obtained, which completes the up-phase.
	 * Then we reverse the process and work top-down until the submap has been completely refined into its full-fledged visibility map.
	 * The down-phase does not work by calling the visibility algorithm recursively on the regions of the top subamp,
	 * but rather it uses data structures left behind during the top-phase (the submaps for the chains and their ray-shooting structures) to speed up the refinement process. */
}